

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMReader.cc
# Opt level: O3

ssize_t __thiscall
OpenMesh::IO::_OMReader_::read(_OMReader_ *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  long lVar2;
  mostream *pmVar3;
  undefined7 extraout_var;
  uint uVar4;
  undefined4 in_register_00000034;
  istream *_is;
  
  _is = (istream *)CONCAT44(in_register_00000034,__fd);
  lVar2 = (**(code **)(*__buf + 200))(__buf);
  if (lVar2 != 0) {
    *(byte *)__nbytes = *(byte *)__nbytes | 1;
    (this->fileOptions_).flags_ = 1;
    if (*(int *)(_is + *(long *)(*(long *)_is + -0x18) + 0x20) == 0) {
      bVar1 = read_binary(this,_is,(BaseImporter *)__buf,(Options *)__nbytes);
      uVar4 = *(uint *)__nbytes;
      if (bVar1) {
        uVar4 = uVar4 | 1;
        *(uint *)__nbytes = uVar4;
      }
      *(uint *)__nbytes = uVar4 & (this->fileOptions_).flags_;
      return CONCAT71(extraout_var,bVar1);
    }
    pmVar3 = omerr();
    std::__ostream_insert<char,std::char_traits<char>>
              (&pmVar3->super_ostream,"[OMReader] : cannot read from stream ",0x25);
    std::ios::widen((char)(pmVar3->super_ostream)._vptr_basic_ostream[-3] + (char)pmVar3);
    std::ostream::put((char)pmVar3);
    std::ostream::flush();
  }
  return 0;
}

Assistant:

bool _OMReader_::read(std::istream& _is, BaseImporter& _bi, Options& _opt)
{
  // check whether importer can give us an OpenMesh BaseKernel
  if (!_bi.kernel())
    return false;

  _opt += Options::Binary; // only binary format supported!
  fileOptions_ = Options::Binary;

  if (!_is.good()) {
    omerr() << "[OMReader] : cannot read from stream " << std::endl;
    return false;
  }

  // Pass stream to read method, remember result
  bool result = read_binary(_is, _bi, _opt);

  if (result)
    _opt += Options::Binary;

  _opt = _opt & fileOptions_;

  return result;
}